

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  int fd;
  int iVar1;
  int __fd;
  uint uVar2;
  __sighandler_t p_Var3;
  int *piVar4;
  pthread_t __th;
  ulong uVar5;
  ulong uVar6;
  cpu_set_t cpuset;
  sigset_t set;
  
  if ((options->flags & 8) != 0) {
    setsid();
  }
  uVar6 = 0;
  if (0 < stdio_count) {
    uVar6 = (ulong)(uint)stdio_count;
  }
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    if ((uint)pipes[uVar5][1] < uVar5) {
      iVar1 = fcntl(pipes[uVar5][1],0,stdio_count);
      pipes[uVar5][1] = iVar1;
      if (iVar1 == -1) goto LAB_003d9d95;
    }
  }
  for (iVar1 = 0; iVar1 < stdio_count; iVar1 = iVar1 + 1) {
    __fd = pipes[iVar1][1];
    if (__fd < 0) {
      if (iVar1 < 3) {
        __fd = open("/dev/null",(uint)(iVar1 != 0) * 2);
        fd = __fd;
        if (-1 < __fd) goto LAB_003d9c8b;
LAB_003d9da3:
        piVar4 = __errno_location();
        iVar1 = -*piVar4;
        goto LAB_003d9db0;
      }
    }
    else {
      fd = pipes[iVar1][0];
LAB_003d9c8b:
      if (iVar1 == __fd) {
        uv__cloexec_fcntl(iVar1,0);
      }
      else {
        iVar1 = dup2(__fd,iVar1);
        if (iVar1 == -1) goto LAB_003d9da3;
      }
      if (iVar1 < 3) {
        uv__nonblock_fcntl(iVar1,0);
      }
      if (stdio_count <= fd) {
        uv__close(fd);
      }
    }
  }
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    if (stdio_count <= pipes[uVar5][1]) {
      uv__close(pipes[uVar5][1]);
    }
  }
  if ((options->cwd == (char *)0x0) || (iVar1 = chdir(options->cwd), iVar1 == 0)) {
    uVar2 = options->flags;
    if ((uVar2 & 3) != 0) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      setgroups(0,(__gid_t *)0x0);
      *piVar4 = iVar1;
      uVar2 = options->flags;
    }
    if ((uVar2 & 2) != 0) {
      iVar1 = setgid(options->gid);
      if (iVar1 != 0) goto LAB_003d9d95;
      uVar2 = options->flags;
    }
    if (((uVar2 & 1) == 0) || (iVar1 = setuid(options->uid), iVar1 == 0)) {
      if (options->cpumask == (char *)0x0) {
LAB_003d9d5d:
        if (options->env != (char **)0x0) {
          _environ = options->env;
        }
        iVar1 = 1;
        do {
          if ((iVar1 != 9) && (iVar1 != 0x13)) {
            if (iVar1 == 0x20) {
              sigemptyset((sigset_t *)&set);
              iVar1 = pthread_sigmask(2,(sigset_t *)&set,(__sigset_t *)0x0);
              if (iVar1 != 0) goto LAB_003d9eb2;
              execvp(options->file,options->args);
              piVar4 = __errno_location();
              iVar1 = -*piVar4;
              goto LAB_003d9db0;
            }
            p_Var3 = signal(iVar1,(__sighandler_t)0x0);
            if (p_Var3 == (__sighandler_t)0xffffffffffffffff) goto LAB_003d9d95;
          }
          iVar1 = iVar1 + 1;
        } while( true );
      }
      uVar2 = uv_cpumask_size();
      if (options->cpumask_size < (ulong)(long)(int)uVar2) {
        __assert_fail("options->cpumask_size >= (size_t)cpumask_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                      ,0x18e,
                      "void uv__process_child_init(const uv_process_options_t *, int, int (*)[2], int)"
                     );
      }
      cpuset.__bits[0xe] = 0;
      cpuset.__bits[0xf] = 0;
      cpuset.__bits[0xc] = 0;
      cpuset.__bits[0xd] = 0;
      cpuset.__bits[10] = 0;
      cpuset.__bits[0xb] = 0;
      cpuset.__bits[8] = 0;
      cpuset.__bits[9] = 0;
      cpuset.__bits[6] = 0;
      cpuset.__bits[7] = 0;
      cpuset.__bits[4] = 0;
      cpuset.__bits[5] = 0;
      cpuset.__bits[2] = 0;
      cpuset.__bits[3] = 0;
      cpuset.__bits[0] = 0;
      cpuset.__bits[1] = 0;
      uVar5 = 0;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if ((uVar5 < 0x400) && (options->cpumask[uVar5] != '\0')) {
          cpuset.__bits[uVar5 >> 6] = cpuset.__bits[uVar5 >> 6] | 1L << ((byte)uVar5 & 0x3f);
        }
      }
      __th = pthread_self();
      iVar1 = pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&cpuset);
      if (iVar1 == 0) goto LAB_003d9d5d;
LAB_003d9eb2:
      iVar1 = -iVar1;
      goto LAB_003d9db0;
    }
  }
LAB_003d9d95:
  piVar4 = __errno_location();
  iVar1 = -*piVar4;
LAB_003d9db0:
  uv__write_int(error_fd,iVar1);
  _exit(0x7f);
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t set;
  int close_fd;
  int use_fd;
  int err;
  int fd;
  int n;
#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
  int r;
  int i;
  int cpumask_size;
  uv__cpu_set_t cpuset;
#endif
#endif

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
    if (pipes[fd][1] == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set
         */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0) {
          uv__write_int(error_fd, UV__ERR(errno));
          _exit(127);
        }
      }
    }

    if (fd == use_fd)
      uv__cloexec_fcntl(use_fd, 0);
    else
      fd = dup2(use_fd, fd);

    if (fd == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }

    if (fd <= 2)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];

    if (use_fd >= stdio_count)
      uv__close(use_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
  if (options->cpumask != NULL) {
    cpumask_size = uv_cpumask_size();
    assert(options->cpumask_size >= (size_t)cpumask_size);

    CPU_ZERO(&cpuset);
    for (i = 0; i < cpumask_size; ++i) {
      if (options->cpumask[i]) {
        CPU_SET(i, &cpuset);
      }
    }

    r = -pthread_setaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
    if (r != 0) {
      uv__write_int(error_fd, r);
      _exit(127);
    }
  }
#endif
#endif

  if (options->env != NULL) {
    environ = options->env;
  }

  /* Reset signal disposition.  Use a hard-coded limit because NSIG
   * is not fixed on Linux: it's either 32, 34 or 64, depending on
   * whether RT signals are enabled.  We are not allowed to touch
   * RT signal handlers, glibc uses them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  /* Reset signal mask. */
  sigemptyset(&set);
  err = pthread_sigmask(SIG_SETMASK, &set, NULL);

  if (err != 0) {
    uv__write_int(error_fd, UV__ERR(err));
    _exit(127);
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, UV__ERR(errno));
  _exit(127);
}